

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeCondition(TranslateToFuzzReader *this)

{
  bool bVar1;
  Expression *value;
  Unary *pUVar2;
  
  value = make(this,(Type)0x2);
  bVar1 = Random::oneIn(&this->random,2);
  if (bVar1) {
    pUVar2 = Builder::makeUnary(&this->builder,EqZInt32,value);
    return (Expression *)pUVar2;
  }
  return value;
}

Assistant:

Expression* TranslateToFuzzReader::makeCondition() {
  // We want a 50-50 chance for the condition to be taken, for interesting
  // execution paths. by itself, there is bias (e.g. most consts are "yes") so
  // even that out with noise
  auto* ret = make(Type::i32);
  if (oneIn(2)) {
    ret = builder.makeUnary(UnaryOp::EqZInt32, ret);
  }
  return ret;
}